

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O1

void __thiscall
util_tests::test_LocaleIndependentAtoi::test_method(test_LocaleIndependentAtoi *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  undefined1 uVar3;
  undefined2 uVar4;
  _Rb_tree_color _Var5;
  int iVar6;
  _Base_ptr p_Var7;
  long *plVar8;
  iterator in_R8;
  iterator pvVar9;
  allocator_type *__a;
  iterator in_R9;
  iterator pvVar10;
  long lVar11;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  __l;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view str_10;
  string_view str_11;
  string_view str_12;
  string_view str_13;
  string_view str_14;
  string_view str_15;
  string_view str_16;
  string_view str_17;
  string_view str_18;
  string_view str_19;
  string_view str_20;
  string_view str_21;
  string_view str_22;
  string_view str_23;
  string_view str_24;
  string_view str_25;
  string_view str_26;
  string_view str_27;
  string_view str_28;
  string_view str_29;
  string_view str_30;
  string_view str_31;
  string_view str_32;
  string_view str_33;
  string_view str_34;
  string_view str_35;
  string_view str_36;
  string_view str_37;
  string_view str_38;
  string_view str_39;
  string_view str_40;
  string_view str_41;
  string_view str_42;
  string_view str_43;
  string_view str_44;
  string_view str_45;
  string_view str_46;
  string_view str_47;
  string_view str_48;
  string_view str_49;
  string_view str_50;
  string_view str_51;
  string_view str_52;
  string_view str_53;
  string_view str_54;
  string_view str_55;
  string_view str_56;
  string_view str_57;
  undefined1 *local_9b0;
  undefined1 *local_9a8;
  char *local_9a0;
  char *local_998;
  undefined1 *local_990;
  undefined1 *local_988;
  char *local_980;
  char *local_978;
  undefined1 *local_970;
  undefined1 *local_968;
  char *local_960;
  char *local_958;
  undefined1 *local_950;
  undefined1 *local_948;
  char *local_940;
  char *local_938;
  undefined1 *local_930;
  undefined1 *local_928;
  char *local_920;
  char *local_918;
  undefined1 *local_910;
  undefined1 *local_908;
  char *local_900;
  char *local_8f8;
  undefined1 *local_8f0;
  undefined1 *local_8e8;
  char *local_8e0;
  char *local_8d8;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  char *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 *local_890;
  undefined1 *local_888;
  char *local_880;
  char *local_878;
  undefined1 *local_870;
  undefined1 *local_868;
  char *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  undefined1 *local_830;
  undefined1 *local_828;
  char *local_820;
  char *local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  undefined1 *local_7d0;
  undefined1 *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  _Rb_tree_node_base local_630;
  char *local_610;
  assertion_result local_608;
  char *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  char *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  char *local_598;
  char *local_590;
  undefined1 *local_588;
  undefined1 *local_580;
  char *local_578;
  char *local_570;
  ulong local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  undefined1 local_200 [8];
  lazy_ostream local_1f8;
  undefined1 *local_1e8;
  char *local_1e0;
  undefined1 local_1d8 [24];
  assertion_result local_1c0;
  undefined1 local_1a8 [16];
  undefined1 *local_198 [2];
  long local_188;
  undefined1 *local_180 [2];
  undefined1 local_170 [16];
  undefined8 local_160;
  undefined1 *local_158 [2];
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined8 local_110;
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined8 local_c0;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined8 local_98;
  long *local_90 [2];
  long local_80 [2];
  undefined8 local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  atoi64_test_pairs;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x2f4;
  file.m_begin = (iterator)&local_210;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_220,msg);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str._M_str = "1234";
  str._M_len = 4;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str);
  local_1d8._8_8_ = local_200;
  local_1d8._0_8_ = &local_568;
  local_568._0_4_ = 0x4d2;
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_198[1] = local_1d8 + 8;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_200._0_4_ == 0x4d2);
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f461,(size_t)&local_1c0,
             0x2f4,local_1a8,"1\'234",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2f5;
  file_00.m_begin = (iterator)&local_230;
  msg_00.m_end = pvVar10;
  msg_00.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_240,
             msg_00);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_00._M_str = "0";
  str_00._M_len = 1;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_00);
  local_568._0_4_ = 0;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_red);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f488,(size_t)&local_1c0,
             0x2f5,local_1a8,"0",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x2f6;
  file_01.m_begin = (iterator)&local_250;
  msg_01.m_end = pvVar10;
  msg_01.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_260,
             msg_01);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_01._M_str = "01234";
  str_01._M_len = 5;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_01);
  local_568._0_4_ = 0x4d2;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == 0x4d2);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f4ac,(size_t)&local_1c0,
             0x2f6,local_1a8,"1\'234",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x2f7;
  file_02.m_begin = (iterator)&local_270;
  msg_02.m_end = pvVar10;
  msg_02.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_280,
             msg_02);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_02._M_str = "-1234";
  str_02._M_len = 5;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_02);
  local_568._0_4_ = 0xfffffb2e;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == 0xfffffb2e);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f4d4,(size_t)&local_1c0,
             0x2f7,local_1a8,"-1\'234",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x2f8;
  file_03.m_begin = (iterator)&local_290;
  msg_03.m_end = pvVar10;
  msg_03.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2a0,
             msg_03);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_03._M_str = " 1";
  str_03._M_len = 2;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_03);
  local_568._0_4_ = 1;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_black);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f4fc,(size_t)&local_1c0,
             0x2f8,local_1a8,"1",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_2b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2a8 = "";
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x2f9;
  file_04.m_begin = (iterator)&local_2b0;
  msg_04.m_end = pvVar10;
  msg_04.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2c0,
             msg_04);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_04._M_str = "1 ";
  str_04._M_len = 2;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_04);
  local_568._0_4_ = 1;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_black);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f521,(size_t)&local_1c0,
             0x2f9,local_1a8,"1",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_2d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x2fa;
  file_05.m_begin = (iterator)&local_2d0;
  msg_05.m_end = pvVar10;
  msg_05.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2e0,
             msg_05);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_05._M_str = "1a";
  str_05._M_len = 2;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_05);
  local_568._0_4_ = 1;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_black);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f546,(size_t)&local_1c0,
             0x2fa,local_1a8,"1",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_2f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x2fb;
  file_06.m_begin = (iterator)&local_2f0;
  msg_06.m_end = pvVar10;
  msg_06.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_300,
             msg_06);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_06._M_str = "1.1";
  str_06._M_len = 3;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_06);
  local_568._0_4_ = 1;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_black);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f56b,(size_t)&local_1c0,
             0x2fb,local_1a8,"1",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_310 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x2fc;
  file_07.m_begin = (iterator)&local_310;
  msg_07.m_end = pvVar10;
  msg_07.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_320,
             msg_07);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_07._M_str = "1.9";
  str_07._M_len = 3;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_07);
  local_568._0_4_ = 1;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_black);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f591,(size_t)&local_1c0,
             0x2fc,local_1a8,"1",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_330 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x2fd;
  file_08.m_begin = (iterator)&local_330;
  msg_08.m_end = pvVar10;
  msg_08.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_340,
             msg_08);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_08._M_str = "+01.9";
  str_08._M_len = 5;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_08);
  local_568._0_4_ = 1;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_black);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f5bd,(size_t)&local_1c0,
             0x2fd,local_1a8,"1",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x2fe;
  file_09.m_begin = (iterator)&local_350;
  msg_09.m_end = pvVar10;
  msg_09.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_360,
             msg_09);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_09._M_str = "-1";
  str_09._M_len = 2;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_09);
  local_568._0_4_ = 0xffffffff;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == ~_S_red);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f5e5,(size_t)&local_1c0,
             0x2fe,local_1a8,"-1",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x2ff;
  file_10.m_begin = (iterator)&local_370;
  msg_10.m_end = pvVar10;
  msg_10.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_380,
             msg_10);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_10._M_str = " -1";
  str_10._M_len = 3;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_10);
  local_568._0_4_ = 0xffffffff;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == ~_S_red);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f60a,(size_t)&local_1c0,
             0x2ff,local_1a8,"-1",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x300;
  file_11.m_begin = (iterator)&local_390;
  msg_11.m_end = pvVar10;
  msg_11.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3a0,
             msg_11);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_11._M_str = "-1 ";
  str_11._M_len = 3;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_11);
  local_568._0_4_ = 0xffffffff;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == ~_S_red);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f630,(size_t)&local_1c0,
             0x300,local_1a8,"-1",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x301;
  file_12.m_begin = (iterator)&local_3b0;
  msg_12.m_end = pvVar10;
  msg_12.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3c0,
             msg_12);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_12._M_str = " -1 ";
  str_12._M_len = 4;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_12);
  local_568._0_4_ = 0xffffffff;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == ~_S_red);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f65b,(size_t)&local_1c0,
             0x301,local_1a8,"-1",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x302;
  file_13.m_begin = (iterator)&local_3d0;
  msg_13.m_end = pvVar10;
  msg_13.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_3e0,
             msg_13);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_13._M_str = "+1";
  str_13._M_len = 2;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_13);
  local_568._0_4_ = 1;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_black);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f682,(size_t)&local_1c0,
             0x302,local_1a8,"1",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x303;
  file_14.m_begin = (iterator)&local_3f0;
  msg_14.m_end = pvVar10;
  msg_14.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_400,
             msg_14);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_14._M_str = " +1";
  str_14._M_len = 3;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_14);
  local_568._0_4_ = 1;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_black);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f6ab,(size_t)&local_1c0,
             0x303,local_1a8,"1",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_410 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x304;
  file_15.m_begin = (iterator)&local_410;
  msg_15.m_end = pvVar10;
  msg_15.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_420,
             msg_15);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_15._M_str = " +1 ";
  str_15._M_len = 4;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_15);
  local_568._0_4_ = 1;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_black);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f6d6,(size_t)&local_1c0,
             0x304,local_1a8,"1",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_430 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_428 = "";
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x306;
  file_16.m_begin = (iterator)&local_430;
  msg_16.m_end = pvVar10;
  msg_16.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_440,
             msg_16);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_16._M_str = "+-1";
  str_16._M_len = 3;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_16);
  local_568._0_4_ = 0;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_red);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f6fd,(size_t)&local_1c0,
             0x306,local_1a8,"0",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_450 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x307;
  file_17.m_begin = (iterator)&local_450;
  msg_17.m_end = pvVar10;
  msg_17.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_460,
             msg_17);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_17._M_str = "-+1";
  str_17._M_len = 3;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_17);
  local_568._0_4_ = 0;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_red);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f723,(size_t)&local_1c0,
             0x307,local_1a8,"0",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_470 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x308;
  file_18.m_begin = (iterator)&local_470;
  msg_18.m_end = pvVar10;
  msg_18.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_480,
             msg_18);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_18._M_str = "++1";
  str_18._M_len = 3;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_18);
  local_568._0_4_ = 0;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_red);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f749,(size_t)&local_1c0,
             0x308,local_1a8,"0",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_490 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_488 = "";
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_498 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x309;
  file_19.m_begin = (iterator)&local_490;
  msg_19.m_end = pvVar10;
  msg_19.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_4a0,
             msg_19);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_19._M_str = "--1";
  str_19._M_len = 3;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_19);
  local_568._0_4_ = 0;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_red);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f76f,(size_t)&local_1c0,
             0x309,local_1a8,"0",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x30a;
  file_20.m_begin = (iterator)&local_4b0;
  msg_20.m_end = pvVar10;
  msg_20.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_4c0,
             msg_20);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  local_200._0_4_ = LocaleIndependentAtoi<int>((string_view)(ZEXT816(0xf6cf21) << 0x40));
  local_568._0_4_ = 0;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_red);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f795,(size_t)&local_1c0,
             0x30a,local_1a8,"0",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x30b;
  file_21.m_begin = (iterator)&local_4d0;
  msg_21.m_end = pvVar10;
  msg_21.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_4e0,
             msg_21);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_20._M_str = "aap";
  str_20._M_len = 3;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_20);
  local_568._0_4_ = 0;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_red);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f7b8,(size_t)&local_1c0,
             0x30b,local_1a8,"0",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_4f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x30c;
  file_22.m_begin = (iterator)&local_4f0;
  msg_22.m_end = pvVar10;
  msg_22.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_500,
             msg_22);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_21._M_str = "0x1";
  str_21._M_len = 3;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_21);
  local_568._0_4_ = 0;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == _S_red);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f7de,(size_t)&local_1c0,
             0x30c,local_1a8,"0",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x30d;
  file_23.m_begin = (iterator)&local_510;
  msg_23.m_end = pvVar10;
  msg_23.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_520,
             msg_23);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_22._M_str = "-32482348723847471234";
  str_22._M_len = 0x15;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_22);
  local_568._0_4_ = 0x80000000;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f804,(size_t)&local_1c0,
             0x30d,local_1a8,"-2\'147\'483\'647 - 1",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_530 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x30e;
  file_24.m_begin = (iterator)&local_530;
  msg_24.m_end = pvVar10;
  msg_24.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_540,
             msg_24);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_23._M_str = "32482348723847471234";
  str_23._M_len = 0x14;
  local_200._0_4_ = LocaleIndependentAtoi<int>(str_23);
  local_568 = CONCAT44(local_568._4_4_,0x7fffffff);
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200._0_4_ == 0x7fffffff);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abcf0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f84f,(size_t)&local_1c0,
             0x30e,local_1a8,"2\'147\'483\'647",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_550 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_548 = "";
  local_560 = &boost::unit_test::basic_cstring<char_const>::null;
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x310;
  file_25.m_begin = (iterator)&local_550;
  msg_25.m_end = pvVar10;
  msg_25.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_560,
             msg_25);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_24._M_str = "-9223372036854775809";
  str_24._M_len = 0x14;
  local_200 = (undefined1  [8])LocaleIndependentAtoi<long>(str_24);
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200 == (undefined1  [8])0x8000000000000000);
  local_568 = 0x8000000000000000;
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ac3f0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f886,(size_t)&local_1c0,
             0x310,local_1a8,"-9\'223\'372\'036\'854\'775\'807LL - 1LL",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_578 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_570 = "";
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  local_580 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x311;
  file_26.m_begin = (iterator)&local_578;
  msg_26.m_end = pvVar10;
  msg_26.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_588,
             msg_26);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_25._M_str = "-9223372036854775808";
  str_25._M_len = 0x14;
  local_200 = (undefined1  [8])LocaleIndependentAtoi<long>(str_25);
  local_568 = 0x8000000000000000;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200 == (undefined1  [8])0x8000000000000000);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013ac3f0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f8bd,(size_t)&local_1c0,
             0x311,local_1a8,"-9\'223\'372\'036\'854\'775\'807LL - 1LL",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_598 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_590 = "";
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x312;
  file_27.m_begin = (iterator)&local_598;
  msg_27.m_end = pvVar10;
  msg_27.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_5a8,
             msg_27);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_26._M_str = "9223372036854775807";
  str_26._M_len = 0x13;
  local_200 = (undefined1  [8])LocaleIndependentAtoi<long>(str_26);
  local_568 = 0x7fffffffffffffff;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_200 == (undefined1  [8])0x7fffffffffffffff);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f8f4,(size_t)&local_1c0,
             0x312,local_1a8,"9\'223\'372\'036\'854\'775\'807",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_5b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x313;
  file_28.m_begin = (iterator)&local_5b8;
  msg_28.m_end = pvVar10;
  msg_28.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_5c8,
             msg_28);
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abb30;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  str_27._M_str = "9223372036854775808";
  str_27._M_len = 0x13;
  local_200 = (undefined1  [8])LocaleIndependentAtoi<long>(str_27);
  local_568 = 0x7fffffffffffffff;
  local_608.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(local_200 == (undefined1  [8])0x7fffffffffffffff);
  local_608.m_message.px = (element_type *)0x0;
  local_608.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c0._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1c0.m_message.px = (element_type *)0xf6c42b;
  local_1d8._8_8_ = local_200;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abed0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8 + 8;
  local_1d8._0_8_ = &local_568;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  atoi64_test_pairs._M_t._M_impl._0_8_ = &PTR__lazy_ostream_013abed0;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)boost::unit_test::lazy_ostream::inst;
  atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_1d8;
  pvVar9 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_608,(lazy_ostream *)(local_200 + 8),1,2,REQUIRE,0xf6f92a,(size_t)&local_1c0,
             0x313,local_1a8,"9\'223\'372\'036\'854\'775\'807",&atoi64_test_pairs);
  boost::detail::shared_count::~shared_count(&local_608.m_message.pn);
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"-9223372036854775809","");
  local_188 = -0x8000000000000000;
  local_180[0] = local_170;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_180,"-9223372036854775808","");
  local_160 = 0x8000000000000000;
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"9223372036854775807","");
  local_138 = 0x7fffffffffffffff;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"9223372036854775808","");
  local_110 = 0x7fffffffffffffff;
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"+-","");
  local_e8 = 0;
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"0x1","");
  local_c0 = 0;
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"ox1","");
  local_98 = 0;
  plVar8 = local_80;
  local_90[0] = plVar8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
  local_70 = 0;
  __a = (allocator_type *)&local_608;
  __l._M_len = 8;
  __l._M_array = (iterator)local_1a8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map(&atoi64_test_pairs,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        (local_200 + 8),__a);
  lVar11 = -0x140;
  do {
    if (plVar8 != (long *)plVar8[-2]) {
      operator_delete((long *)plVar8[-2],*plVar8 + 1);
    }
    plVar8 = plVar8 + -5;
    lVar11 = lVar11 + 0x28;
  } while (lVar11 != 0);
  p_Var1 = &atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      p_Var1) {
    p_Var7 = atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_5d8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_5d0 = "";
      local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_29.m_end = (iterator)0x321;
      file_29.m_begin = (iterator)&local_5d8;
      msg_29.m_end = pvVar9;
      msg_29.m_begin = (iterator)__a;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_5e8,
                 msg_29);
      local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
      local_608._0_8_ = &PTR__lazy_ostream_013abb30;
      local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_5f0 = "";
      str_28._M_str = *(char **)(p_Var7 + 1);
      str_28._M_len = (size_t)p_Var7[1]._M_parent;
      local_568 = LocaleIndependentAtoi<long>(str_28);
      local_200 = (undefined1  [8])(p_Var7 + 2);
      local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(local_568 == *(ulong *)(p_Var7 + 2));
      local_1c0.m_message.px = (element_type *)0x0;
      local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_1d8._8_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_1d8._16_8_ = "";
      local_1d8._0_8_ = &local_568;
      local_1a8[8] = 0;
      local_1a8._0_8_ = &PTR__lazy_ostream_013abed0;
      local_198[0] = boost::unit_test::lazy_ostream::inst;
      local_198[1] = local_1d8;
      local_1f8.m_empty = false;
      local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abed0;
      local_1e8 = boost::unit_test::lazy_ostream::inst;
      local_1e0 = local_200;
      __a = (allocator_type *)0x1;
      pvVar9 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6f967,(size_t)(local_1d8 + 8),
                 0x321,local_1a8,"pair.second",local_200 + 8);
      boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  if ((_Rb_tree_header *)atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      p_Var1) {
    p_Var7 = atoi64_test_pairs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_630._M_right = (_Base_ptr)0xf6c3c8;
      local_610 = "";
      local_630._M_parent = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
      local_630._M_left = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
      file_30.m_end = (iterator)0x326;
      file_30.m_begin = (iterator)&local_630._M_right;
      msg_30.m_end = pvVar9;
      msg_30.m_begin = (iterator)__a;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,
                 (size_t)&local_630._M_parent,msg_30);
      local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
      local_608._0_8_ = &PTR__lazy_ostream_013abb30;
      local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_5f0 = "";
      str_29._M_str = *(char **)(p_Var7 + 1);
      str_29._M_len = (size_t)p_Var7[1]._M_parent;
      local_568 = LocaleIndependentAtoi<long>(str_29);
      local_630._0_8_ = strtoll(*(char **)(p_Var7 + 1),(char **)0x0,10);
      local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)(local_568 == local_630._0_8_);
      local_1c0.m_message.px = (element_type *)0x0;
      local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_1d8._8_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
      ;
      local_1d8._16_8_ = "";
      local_1d8._0_8_ = &local_568;
      local_1a8[8] = 0;
      local_1a8._0_8_ = &PTR__lazy_ostream_013abed0;
      local_198[0] = boost::unit_test::lazy_ostream::inst;
      local_198[1] = local_1d8;
      local_200 = (undefined1  [8])&local_630;
      local_1f8.m_empty = false;
      local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abed0;
      local_1e8 = boost::unit_test::lazy_ostream::inst;
      local_1e0 = local_200;
      __a = (allocator_type *)0x1;
      pvVar9 = (iterator)0x2;
      boost::test_tools::tt_detail::report_assertion
                (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6f967,(size_t)(local_1d8 + 8),
                 0x326,local_1a8,"atoi64_legacy(pair.first)",local_200 + 8);
      boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  local_640 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x329;
  file_31.m_begin = (iterator)&local_640;
  msg_31.m_end = pvVar9;
  msg_31.m_begin = (iterator)__a;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_650,
             msg_31);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_30._M_str = "-1";
  str_30._M_len = 2;
  local_568 = LocaleIndependentAtoi<unsigned_long>(str_30);
  local_200 = (undefined1  [8])&local_630;
  local_630._0_8_ = local_630._0_8_ & 0xffffffff00000000;
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_568;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abb70;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbb0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_568 == 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6f9b8,(size_t)(local_1d8 + 8),
             0x329,local_1a8,"0U",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_658 = "";
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x32a;
  file_32.m_begin = (iterator)&local_660;
  msg_32.m_end = pvVar10;
  msg_32.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_670,
             msg_32);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_31._M_str = "0";
  str_31._M_len = 1;
  local_568 = LocaleIndependentAtoi<unsigned_long>(str_31);
  local_630._0_8_ = local_630._0_8_ & 0xffffffff00000000;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_568 == 0);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_568;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abb70;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_630;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbb0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6f9de,(size_t)(local_1d8 + 8),
             0x32a,local_1a8,"0U",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x32b;
  file_33.m_begin = (iterator)&local_680;
  msg_33.m_end = pvVar10;
  msg_33.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_690,
             msg_33);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_32._M_str = "18446744073709551615";
  str_32._M_len = 0x14;
  local_568 = LocaleIndependentAtoi<unsigned_long>(str_32);
  local_630._M_color = ~_S_red;
  local_630._4_4_ = 0xffffffff;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_568 == 0xffffffffffffffff);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_568;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abb70;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_630;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad550;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fa03,(size_t)(local_1d8 + 8),
             0x32b,local_1a8,"18\'446\'744\'073\'709\'551\'615ULL",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_6a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x32c;
  file_34.m_begin = (iterator)&local_6a0;
  msg_34.m_end = pvVar10;
  msg_34.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_6b0,
             msg_34);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_33._M_str = "18446744073709551616";
  str_33._M_len = 0x14;
  local_568 = LocaleIndependentAtoi<unsigned_long>(str_33);
  local_630._M_color = ~_S_red;
  local_630._4_4_ = 0xffffffff;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_568 == 0xffffffffffffffff);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_568;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abb70;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_630;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ad550;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fa3b,(size_t)(local_1d8 + 8),
             0x32c,local_1a8,"18\'446\'744\'073\'709\'551\'615ULL",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_6b8 = "";
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x32e;
  file_35.m_begin = (iterator)&local_6c0;
  msg_35.m_end = pvVar10;
  msg_35.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_6d0,
             msg_35);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_34._M_str = "-2147483649";
  str_34._M_len = 0xb;
  _Var5 = LocaleIndependentAtoi<int>(str_34);
  local_568 = 0xffffffff80000000;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ac3f0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_630._M_color = _Var5;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fa73,(size_t)(local_1d8 + 8),
             0x32e,local_1a8,"-2\'147\'483\'648LL",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_6d8 = "";
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x32f;
  file_36.m_begin = (iterator)&local_6e0;
  msg_36.m_end = pvVar10;
  msg_36.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_6f0,
             msg_36);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_35._M_str = "-2147483648";
  str_35._M_len = 0xb;
  local_630._M_color = LocaleIndependentAtoi<int>(str_35);
  local_568 = 0xffffffff80000000;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ac3f0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6faa1,(size_t)(local_1d8 + 8),
             0x32f,local_1a8,"-2\'147\'483\'648LL",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_700 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_6f8 = "";
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x330;
  file_37.m_begin = (iterator)&local_700;
  msg_37.m_end = pvVar10;
  msg_37.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_710,
             msg_37);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_36._M_str = "2147483647";
  str_36._M_len = 10;
  iVar6 = LocaleIndependentAtoi<int>(str_36);
  local_630._M_color = 0x7fffffff;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar6 == 0x7fffffff);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_568;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_630;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_568._0_4_ = iVar6;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6facf,(size_t)(local_1d8 + 8),
             0x330,local_1a8,"2\'147\'483\'647",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x331;
  file_38.m_begin = (iterator)&local_720;
  msg_38.m_end = pvVar10;
  msg_38.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_730,
             msg_38);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_37._M_str = "2147483648";
  str_37._M_len = 10;
  local_568._0_4_ = LocaleIndependentAtoi<int>(str_37);
  local_630._M_color = 0x7fffffff;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((uint)local_568 == 0x7fffffff);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_568;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_630;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fafc,(size_t)(local_1d8 + 8),
             0x331,local_1a8,"2\'147\'483\'647",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_738 = "";
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x333;
  file_39.m_begin = (iterator)&local_740;
  msg_39.m_end = pvVar10;
  msg_39.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_750,
             msg_39);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_38._M_str = "-1";
  str_38._M_len = 2;
  local_568._0_4_ = LocaleIndependentAtoi<unsigned_int>(str_38);
  local_630._M_color = _S_red;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((uint)local_568 == 0);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_568;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_630;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbb0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fb29,(size_t)(local_1d8 + 8),
             0x333,local_1a8,"0U",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_760 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_758 = "";
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x334;
  file_40.m_begin = (iterator)&local_760;
  msg_40.m_end = pvVar10;
  msg_40.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_770,
             msg_40);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_39._M_str = "0";
  str_39._M_len = 1;
  local_568._0_4_ = LocaleIndependentAtoi<unsigned_int>(str_39);
  local_630._M_color = _S_red;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((uint)local_568 == 0);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_568;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_630;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbb0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fb4f,(size_t)(local_1d8 + 8),
             0x334,local_1a8,"0U",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x335;
  file_41.m_begin = (iterator)&local_780;
  msg_41.m_end = pvVar10;
  msg_41.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_790,
             msg_41);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_40._M_str = "4294967295";
  str_40._M_len = 10;
  local_568._0_4_ = LocaleIndependentAtoi<unsigned_int>(str_40);
  local_630._M_color = ~_S_red;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((uint)local_568 == 0xffffffff);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_568;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_630;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbb0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fb74,(size_t)(local_1d8 + 8),
             0x335,local_1a8,"4\'294\'967\'295U",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_798 = "";
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x336;
  file_42.m_begin = (iterator)&local_7a0;
  msg_42.m_end = pvVar10;
  msg_42.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_7b0,
             msg_42);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_41._M_str = "4294967296";
  str_41._M_len = 10;
  local_568._0_4_ = LocaleIndependentAtoi<unsigned_int>(str_41);
  local_630._M_color = ~_S_red;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((uint)local_568 == 0xffffffff);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_568;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013abbb0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_630;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbb0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fba2,(size_t)(local_1d8 + 8),
             0x336,local_1a8,"4\'294\'967\'295U",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_7c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_7b8 = "";
  local_7d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0x338;
  file_43.m_begin = (iterator)&local_7c0;
  msg_43.m_end = pvVar10;
  msg_43.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_7d0,
             msg_43);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_42._M_str = "-32769";
  str_42._M_len = 6;
  uVar4 = LocaleIndependentAtoi<short>(str_42);
  local_568._0_4_ = 0xffff8000;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(uVar4 == 0x8000);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013b11a0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_630._M_color._0_2_ = uVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fbd0,(size_t)(local_1d8 + 8),
             0x338,local_1a8,"-32\'768",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x339;
  file_44.m_begin = (iterator)&local_7e0;
  msg_44.m_end = pvVar10;
  msg_44.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_7f0,
             msg_44);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_43._M_str = "-32768";
  str_43._M_len = 6;
  local_630._M_color._0_2_ = LocaleIndependentAtoi<short>(str_43);
  local_568._0_4_ = 0xffff8000;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined2)local_630._M_color == 0x8000);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013b11a0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fbf9,(size_t)(local_1d8 + 8),
             0x339,local_1a8,"-32\'768",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_7f8 = "";
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  file_45.m_end = (iterator)0x33a;
  file_45.m_begin = (iterator)&local_800;
  msg_45.m_end = pvVar10;
  msg_45.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_810,
             msg_45);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_44._M_str = "32767";
  str_44._M_len = 5;
  local_630._M_color._0_2_ = LocaleIndependentAtoi<short>(str_44);
  local_568._0_4_ = 0x7fff;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined2)local_630._M_color == 0x7fff);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013b11a0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fc22,(size_t)(local_1d8 + 8),
             0x33a,local_1a8,"32\'767",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_820 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_818 = "";
  local_830 = &boost::unit_test::basic_cstring<char_const>::null;
  local_828 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0x33b;
  file_46.m_begin = (iterator)&local_820;
  msg_46.m_end = pvVar10;
  msg_46.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_830,
             msg_46);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_45._M_str = "32768";
  str_45._M_len = 5;
  local_630._M_color._0_2_ = LocaleIndependentAtoi<short>(str_45);
  local_568._0_4_ = 0x7fff;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined2)local_630._M_color == 0x7fff);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013b11a0;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fc4a,(size_t)(local_1d8 + 8),
             0x33b,local_1a8,"32\'767",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_838 = "";
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  file_47.m_end = (iterator)0x33d;
  file_47.m_begin = (iterator)&local_840;
  msg_47.m_end = pvVar10;
  msg_47.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_850,
             msg_47);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_46._M_str = "-1";
  str_46._M_len = 2;
  local_630._M_color._0_2_ = LocaleIndependentAtoi<unsigned_short>(str_46);
  local_568._0_4_ = 0;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined2)local_630._M_color == _S_red);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ac808;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbb0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fc72,(size_t)(local_1d8 + 8),
             0x33d,local_1a8,"0U",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_858 = "";
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  file_48.m_end = (iterator)0x33e;
  file_48.m_begin = (iterator)&local_860;
  msg_48.m_end = pvVar10;
  msg_48.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_870,
             msg_48);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_47._M_str = "0";
  str_47._M_len = 1;
  local_630._M_color._0_2_ = LocaleIndependentAtoi<unsigned_short>(str_47);
  local_568._0_4_ = 0;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined2)local_630._M_color == _S_red);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ac808;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbb0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fc98,(size_t)(local_1d8 + 8),
             0x33e,local_1a8,"0U",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_880 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_878 = "";
  local_890 = &boost::unit_test::basic_cstring<char_const>::null;
  local_888 = &boost::unit_test::basic_cstring<char_const>::null;
  file_49.m_end = (iterator)0x33f;
  file_49.m_begin = (iterator)&local_880;
  msg_49.m_end = pvVar10;
  msg_49.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_890,
             msg_49);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_48._M_str = "65535";
  str_48._M_len = 5;
  local_630._M_color._0_2_ = LocaleIndependentAtoi<unsigned_short>(str_48);
  local_568._0_4_ = 0xffff;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined2)local_630._M_color == 0xffff);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ac808;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbb0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fcbd,(size_t)(local_1d8 + 8),
             0x33f,local_1a8,"65\'535U",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_8a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_898 = "";
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_50.m_end = (iterator)0x340;
  file_50.m_begin = (iterator)&local_8a0;
  msg_50.m_end = pvVar10;
  msg_50.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_8b0,
             msg_50);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_49._M_str = "65536";
  str_49._M_len = 5;
  local_630._M_color._0_2_ = LocaleIndependentAtoi<unsigned_short>(str_49);
  local_568._0_4_ = 0xffff;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined2)local_630._M_color == 0xffff);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ac808;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbb0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fce6,(size_t)(local_1d8 + 8),
             0x340,local_1a8,"65\'535U",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_8c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_8b8 = "";
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_51.m_end = (iterator)0x342;
  file_51.m_begin = (iterator)&local_8c0;
  msg_51.m_end = pvVar10;
  msg_51.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_8d0,
             msg_51);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_50._M_str = "-129";
  str_50._M_len = 4;
  uVar3 = LocaleIndependentAtoi<signed_char>(str_50);
  local_568._0_4_ = 0xffffff80;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(uVar3 == 0x80);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013b0798;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  local_630._M_color._0_1_ = uVar3;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fd0f,(size_t)(local_1d8 + 8),
             0x342,local_1a8,"-128",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_8e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_8d8 = "";
  local_8f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_52.m_end = (iterator)0x343;
  file_52.m_begin = (iterator)&local_8e0;
  msg_52.m_end = pvVar10;
  msg_52.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_8f0,
             msg_52);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_51._M_str = "-128";
  str_51._M_len = 4;
  local_630._M_color._0_1_ = LocaleIndependentAtoi<signed_char>(str_51);
  local_568._0_4_ = 0xffffff80;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined1)local_630._M_color == 0x80);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013b0798;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fd35,(size_t)(local_1d8 + 8),
             0x343,local_1a8,"-128",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_900 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_8f8 = "";
  local_910 = &boost::unit_test::basic_cstring<char_const>::null;
  local_908 = &boost::unit_test::basic_cstring<char_const>::null;
  file_53.m_end = (iterator)0x344;
  file_53.m_begin = (iterator)&local_900;
  msg_53.m_end = pvVar10;
  msg_53.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_910,
             msg_53);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_52._M_str = "127";
  str_52._M_len = 3;
  local_630._M_color._0_1_ = LocaleIndependentAtoi<signed_char>(str_52);
  local_568._0_4_ = 0x7f;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined1)local_630._M_color == 0x7f);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013b0798;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fd5b,(size_t)(local_1d8 + 8),
             0x344,local_1a8,"127",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_920 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_918 = "";
  local_930 = &boost::unit_test::basic_cstring<char_const>::null;
  local_928 = &boost::unit_test::basic_cstring<char_const>::null;
  file_54.m_end = (iterator)0x345;
  file_54.m_begin = (iterator)&local_920;
  msg_54.m_end = pvVar10;
  msg_54.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_930,
             msg_54);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_53._M_str = "128";
  str_53._M_len = 3;
  local_630._M_color._0_1_ = LocaleIndependentAtoi<signed_char>(str_53);
  local_568._0_4_ = 0x7f;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined1)local_630._M_color == 0x7f);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013b0798;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abcf0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fd80,(size_t)(local_1d8 + 8),
             0x345,local_1a8,"127",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_940 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_938 = "";
  local_950 = &boost::unit_test::basic_cstring<char_const>::null;
  local_948 = &boost::unit_test::basic_cstring<char_const>::null;
  file_55.m_end = (iterator)0x347;
  file_55.m_begin = (iterator)&local_940;
  msg_55.m_end = pvVar10;
  msg_55.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_950,
             msg_55);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_54._M_str = "-1";
  str_54._M_len = 2;
  local_630._M_color._0_1_ = LocaleIndependentAtoi<unsigned_char>(str_54);
  local_568._0_4_ = 0;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined1)local_630._M_color == _S_red);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ac658;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbb0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fda5,(size_t)(local_1d8 + 8),
             0x347,local_1a8,"0U",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_960 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_958 = "";
  local_970 = &boost::unit_test::basic_cstring<char_const>::null;
  local_968 = &boost::unit_test::basic_cstring<char_const>::null;
  file_56.m_end = (iterator)0x348;
  file_56.m_begin = (iterator)&local_960;
  msg_56.m_end = pvVar10;
  msg_56.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_970,
             msg_56);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_55._M_str = "0";
  str_55._M_len = 1;
  local_630._M_color._0_1_ = LocaleIndependentAtoi<unsigned_char>(str_55);
  local_568._0_4_ = 0;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined1)local_630._M_color == _S_red);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ac658;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbb0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fdca,(size_t)(local_1d8 + 8),
             0x348,local_1a8,"0U",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_980 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_978 = "";
  local_990 = &boost::unit_test::basic_cstring<char_const>::null;
  local_988 = &boost::unit_test::basic_cstring<char_const>::null;
  file_57.m_end = (iterator)0x349;
  file_57.m_begin = (iterator)&local_980;
  msg_57.m_end = pvVar10;
  msg_57.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_990,
             msg_57);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_56._M_str = "255";
  str_56._M_len = 3;
  local_630._M_color._0_1_ = LocaleIndependentAtoi<unsigned_char>(str_56);
  local_568._0_4_ = 0xff;
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((undefined1)local_630._M_color == 0xff);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ac658;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbb0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  pvVar9 = (iterator)0x1;
  pvVar10 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fdee,(size_t)(local_1d8 + 8),
             0x349,local_1a8,"255U",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  local_9a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_998 = "";
  local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_58.m_end = (iterator)0x34a;
  file_58.m_begin = (iterator)&local_9a0;
  msg_58.m_end = pvVar10;
  msg_58.m_begin = pvVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_9b0,
             msg_58);
  local_608.m_message.px = (element_type *)((ulong)local_608.m_message.px & 0xffffffffffffff00);
  local_608._0_8_ = &PTR__lazy_ostream_013abb30;
  local_608.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5f0 = "";
  str_57._M_str = "256";
  str_57._M_len = 3;
  local_630._M_color._0_1_ = LocaleIndependentAtoi<unsigned_char>(str_57);
  local_568 = CONCAT44(local_568._4_4_,0xff);
  local_1c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((undefined1)local_630._M_color == 0xff);
  local_1c0.m_message.px = (element_type *)0x0;
  local_1c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8._8_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
  ;
  local_1d8._16_8_ = "";
  local_1d8._0_8_ = &local_630;
  local_1a8[8] = 0;
  local_1a8._0_8_ = &PTR__lazy_ostream_013ac658;
  local_198[0] = boost::unit_test::lazy_ostream::inst;
  local_198[1] = local_1d8;
  local_200 = (undefined1  [8])&local_568;
  local_1f8.m_empty = false;
  local_1f8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abbb0;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = local_200;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c0,(lazy_ostream *)&local_608,1,2,REQUIRE,0xf6fe14,(size_t)(local_1d8 + 8),
             0x34a,local_1a8,"255U",local_200 + 8);
  boost::detail::shared_count::~shared_count(&local_1c0.m_message.pn);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~_Rb_tree(&atoi64_test_pairs._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_LocaleIndependentAtoi)
{
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1234"), 1'234);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("0"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("01234"), 1'234);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-1234"), -1'234);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" 1"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1 "), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1a"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1.1"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("1.9"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("+01.9"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-1"), -1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" -1"), -1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-1 "), -1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" -1 "), -1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("+1"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" +1"), 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(" +1 "), 1);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("+-1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-+1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("++1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("--1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>(""), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("aap"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("0x1"), 0);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-32482348723847471234"), -2'147'483'647 - 1);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("32482348723847471234"), 2'147'483'647);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>("-9223372036854775809"), -9'223'372'036'854'775'807LL - 1LL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>("-9223372036854775808"), -9'223'372'036'854'775'807LL - 1LL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>("9223372036854775807"), 9'223'372'036'854'775'807);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>("9223372036854775808"), 9'223'372'036'854'775'807);

    std::map<std::string, int64_t> atoi64_test_pairs = {
        {"-9223372036854775809", std::numeric_limits<int64_t>::min()},
        {"-9223372036854775808", -9'223'372'036'854'775'807LL - 1LL},
        {"9223372036854775807", 9'223'372'036'854'775'807},
        {"9223372036854775808", std::numeric_limits<int64_t>::max()},
        {"+-", 0},
        {"0x1", 0},
        {"ox1", 0},
        {"", 0},
    };

    for (const auto& pair : atoi64_test_pairs) {
        BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>(pair.first), pair.second);
    }

    // Ensure legacy compatibility with previous versions of Bitcoin Core's atoi64
    for (const auto& pair : atoi64_test_pairs) {
        BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int64_t>(pair.first), atoi64_legacy(pair.first));
    }

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint64_t>("-1"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint64_t>("0"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint64_t>("18446744073709551615"), 18'446'744'073'709'551'615ULL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint64_t>("18446744073709551616"), 18'446'744'073'709'551'615ULL);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-2147483649"), -2'147'483'648LL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("-2147483648"), -2'147'483'648LL);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("2147483647"), 2'147'483'647);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int32_t>("2147483648"), 2'147'483'647);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint32_t>("-1"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint32_t>("0"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint32_t>("4294967295"), 4'294'967'295U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint32_t>("4294967296"), 4'294'967'295U);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int16_t>("-32769"), -32'768);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int16_t>("-32768"), -32'768);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int16_t>("32767"), 32'767);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int16_t>("32768"), 32'767);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint16_t>("-1"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint16_t>("0"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint16_t>("65535"), 65'535U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint16_t>("65536"), 65'535U);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int8_t>("-129"), -128);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int8_t>("-128"), -128);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int8_t>("127"), 127);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<int8_t>("128"), 127);

    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint8_t>("-1"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint8_t>("0"), 0U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint8_t>("255"), 255U);
    BOOST_CHECK_EQUAL(LocaleIndependentAtoi<uint8_t>("256"), 255U);
}